

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::CopyArray(NULLCAutoArray *dst,NULLCAutoArray src)

{
  ExternTypeInfo *pEVar1;
  char *__dest;
  
  if (dst == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    return;
  }
  dst->typeID = src.typeID;
  dst->len = src.len;
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),src.typeID);
  __dest = (char *)AllocObject(pEVar1->size * src.len,src.typeID);
  dst->ptr = __dest;
  if (src.len != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),src.typeID);
    memcpy(__dest,src.ptr,(ulong)(src.len * pEVar1->size));
    return;
  }
  return;
}

Assistant:

void NULLC::CopyArray(NULLCAutoArray* dst, NULLCAutoArray src)
{
	if(!dst)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	dst->typeID = src.typeID;
	dst->len = src.len;
	dst->ptr = (char*)NULLC::AllocObject(src.len * linker->exTypes[src.typeID].size, src.typeID);

	if(src.len)
		memcpy(dst->ptr, src.ptr, unsigned(src.len * linker->exTypes[src.typeID].size));
}